

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O2

void __thiscall
coins_tests::CacheTest::SimulationTest(CacheTest *this,CCoinsView *base,bool fake_best_block)

{
  COutPoint *outpoint;
  uchar *puVar1;
  long lVar2;
  CCoinsViewCache *pCVar3;
  CCoinsViewCacheTest *pCVar4;
  long lVar5;
  readonly_property<bool> rVar6;
  readonly_property<bool> rVar7;
  readonly_property<bool> rVar8;
  readonly_property<bool> rVar9;
  byte bVar10;
  bool bVar11;
  readonly_property<bool> rVar12;
  readonly_property<bool> rVar13;
  readonly_property<bool> rVar14;
  readonly_property<bool> rVar15;
  readonly_property<bool> rVar16;
  readonly_property<bool> rVar17;
  int iVar18;
  int iVar19;
  unsigned_long uVar20;
  mapped_type *a;
  uint64_t uVar21;
  uint64_t uVar22;
  Coin *a_00;
  _Rb_tree_node_base *p_Var23;
  readonly_property<bool> rVar24;
  uint uVar25;
  ulong uVar26;
  unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  *test;
  pointer puVar27;
  iterator in_R8;
  iterator pvVar28;
  iterator in_R9;
  iterator pvVar29;
  FastRandomContext *this_00;
  FastRandomContext *pFVar30;
  pointer puVar31;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  FastRandomContext *rng;
  Coin *local_560;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  assertion_result local_1f0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_> txids;
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  stack;
  CCoinsView *base_local;
  undefined1 local_e8 [8];
  element_type *peStack_e0;
  shared_count sStack_d8;
  char **ppcStack_d0;
  uint32_t local_c8;
  Coin newcoin;
  value_type txid;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  result;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &result._M_t._M_impl.super__Rb_tree_header._M_header;
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  result._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  stack.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  stack.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  stack.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  base_local = base;
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       result._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::make_unique<(anonymous_namespace)::CCoinsViewCacheTest,CCoinsView*&>((CCoinsView **)&newcoin)
  ;
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::push_back(&stack,(value_type *)&newcoin);
  if (newcoin.out.nValue != 0) {
    (**(code **)(*(long *)newcoin.out.nValue + 0x38))();
  }
  txids.
  super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  txids.
  super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  txids.
  super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>::
  resize(&txids,5000);
  pFVar30 = &(this->super_BasicTestingSetup).m_rng;
  for (uVar25 = 0; uVar26 = (ulong)uVar25,
      uVar26 < (ulong)((long)txids.
                             super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)txids.
                             super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5); uVar25 = uVar25 + 1) {
    RandomMixin<FastRandomContext>::rand256
              ((uint256 *)&newcoin,&pFVar30->super_RandomMixin<FastRandomContext>);
    puVar1 = txids.
             super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar26].m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 0x10;
    *(undefined8 *)puVar1 = newcoin.out.scriptPubKey.super_CScriptBase._union._8_8_;
    *(undefined8 *)(puVar1 + 8) = newcoin.out.scriptPubKey.super_CScriptBase._union._16_8_;
    *(CAmount *)
     txids.
     super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
     ._M_impl.super__Vector_impl_data._M_start[uVar26].m_wrapped.super_base_blob<256U>.m_data.
     _M_elems = newcoin.out.nValue;
    *(char **)(txids.
               super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar26].m_wrapped.super_base_blob<256U>.
               m_data._M_elems + 8) =
         newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
  }
  iVar19 = 0;
  rVar17.super_class_property<bool>.value = (class_property<bool>)false;
  rVar24.super_class_property<bool>.value = (class_property<bool>)false;
  rVar16.super_class_property<bool>.value = (class_property<bool>)false;
  rVar15.super_class_property<bool>.value = (class_property<bool>)false;
  rVar8.super_class_property<bool>.value = (class_property<bool>)false;
  rVar12.super_class_property<bool>.value = (class_property<bool>)false;
  rVar13.super_class_property<bool>.value = (class_property<bool>)false;
  rVar14.super_class_property<bool>.value = (class_property<bool>)false;
  rVar7.super_class_property<bool>.value = (class_property<bool>)false;
  rVar6.super_class_property<bool>.value = (class_property<bool>)false;
  rng = pFVar30;
  do {
    if (iVar19 == 40000) {
      local_340 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_338 = "";
      local_350 = &boost::unit_test::basic_cstring<char_const>::null;
      local_348 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_09.m_end = in_R9;
      msg_09.m_begin = in_R8;
      file_09.m_end = (iterator)0x113;
      file_09.m_begin = (iterator)&local_340;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_350,
                 msg_09);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_4a1993;
      txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ = (long)"removed_all_caches" + 0x12
      ;
      newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
           (char *)((ulong)newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
                           indirect & 0xffffffffffffff00);
      newcoin.out.nValue = (CAmount)&PTR__lazy_ostream_0113a070;
      newcoin.out.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst
      ;
      local_360 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_358 = "";
      pvVar28 = &DAT_00000001;
      pvVar29 = (iterator)0x0;
      newcoin.out.scriptPubKey.super_CScriptBase._union._16_8_ = &txid;
      local_e8[0] = rVar6.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)&newcoin,1,0,WARN,(check_type)rng,
                 (size_t)&local_360,0x113);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      local_370 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_368 = "";
      local_380 = &boost::unit_test::basic_cstring<char_const>::null;
      local_378 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_10.m_end = pvVar29;
      msg_10.m_begin = pvVar28;
      file_10.m_end = (iterator)0x114;
      file_10.m_begin = (iterator)&local_370;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_380,
                 msg_10);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_4a199f;
      txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ = (long)"reached_4_caches" + 0x10;
      newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
           (char *)((ulong)newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
                           indirect & 0xffffffffffffff00);
      newcoin.out.nValue = (CAmount)&PTR__lazy_ostream_0113a070;
      newcoin.out.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst
      ;
      local_390 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_388 = "";
      pvVar28 = &DAT_00000001;
      pvVar29 = (iterator)0x0;
      newcoin.out.scriptPubKey.super_CScriptBase._union._16_8_ = &txid;
      local_e8[0] = rVar7.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)&newcoin,1,0,WARN,(check_type)rng,
                 (size_t)&local_390,0x114);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      local_3a0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_398 = "";
      local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_11.m_end = pvVar29;
      msg_11.m_begin = pvVar28;
      file_11.m_end = (iterator)0x115;
      file_11.m_begin = (iterator)&local_3a0;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_3b0,
                 msg_11);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_4a19b9;
      txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ = (long)"added_an_entry" + 0xe;
      newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
           (char *)((ulong)newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
                           indirect & 0xffffffffffffff00);
      newcoin.out.nValue = (CAmount)&PTR__lazy_ostream_0113a070;
      newcoin.out.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst
      ;
      local_3c0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_3b8 = "";
      pvVar28 = &DAT_00000001;
      pvVar29 = (iterator)0x0;
      newcoin.out.scriptPubKey.super_CScriptBase._union._16_8_ = &txid;
      local_e8[0] = rVar14.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)&newcoin,1,0,WARN,(check_type)rng,
                 (size_t)&local_3c0,0x115);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      local_3d0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_3c8 = "";
      local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_12.m_end = pvVar29;
      msg_12.m_begin = pvVar28;
      file_12.m_end = (iterator)0x116;
      file_12.m_begin = (iterator)&local_3d0;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_3e0,
                 msg_12);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_4a19c5;
      txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
           (long)"added_an_unspendable_entry" + 0x1a;
      newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
           (char *)((ulong)newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
                           indirect & 0xffffffffffffff00);
      newcoin.out.nValue = (CAmount)&PTR__lazy_ostream_0113a070;
      newcoin.out.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst
      ;
      local_3f0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_3e8 = "";
      pvVar28 = &DAT_00000001;
      pvVar29 = (iterator)0x0;
      newcoin.out.scriptPubKey.super_CScriptBase._union._16_8_ = &txid;
      local_e8[0] = rVar13.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)&newcoin,1,0,WARN,(check_type)rng,
                 (size_t)&local_3f0,0x116);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      local_400 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_3f8 = "";
      local_410 = &boost::unit_test::basic_cstring<char_const>::null;
      local_408 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_13.m_end = pvVar29;
      msg_13.m_begin = pvVar28;
      file_13.m_end = (iterator)0x117;
      file_13.m_begin = (iterator)&local_400;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_410,
                 msg_13);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_4a19d1;
      txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ = (long)"removed_an_entry" + 0x10;
      newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
           (char *)((ulong)newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
                           indirect & 0xffffffffffffff00);
      newcoin.out.nValue = (CAmount)&PTR__lazy_ostream_0113a070;
      newcoin.out.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst
      ;
      local_420 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_418 = "";
      pvVar28 = &DAT_00000001;
      pvVar29 = (iterator)0x0;
      newcoin.out.scriptPubKey.super_CScriptBase._union._16_8_ = &txid;
      local_e8[0] = rVar12.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)&newcoin,1,0,WARN,(check_type)rng,
                 (size_t)&local_420,0x117);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      local_430 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_428 = "";
      local_440 = &boost::unit_test::basic_cstring<char_const>::null;
      local_438 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_14.m_end = pvVar29;
      msg_14.m_begin = pvVar28;
      file_14.m_end = (iterator)0x118;
      file_14.m_begin = (iterator)&local_430;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_440,
                 msg_14);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_4a19dd;
      txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ = (long)"updated_an_entry" + 0x10;
      newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
           (char *)((ulong)newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
                           indirect & 0xffffffffffffff00);
      newcoin.out.nValue = (CAmount)&PTR__lazy_ostream_0113a070;
      newcoin.out.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst
      ;
      local_450 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_448 = "";
      pvVar28 = &DAT_00000001;
      pvVar29 = (iterator)0x0;
      newcoin.out.scriptPubKey.super_CScriptBase._union._16_8_ = &txid;
      local_e8[0] = rVar8.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)&newcoin,1,0,WARN,(check_type)rng,
                 (size_t)&local_450,0x118);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      local_460 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_458 = "";
      local_470 = &boost::unit_test::basic_cstring<char_const>::null;
      local_468 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_15.m_end = pvVar29;
      msg_15.m_begin = pvVar28;
      file_15.m_end = (iterator)0x119;
      file_15.m_begin = (iterator)&local_460;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_470,
                 msg_15);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_4a19e9;
      txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ = (long)"found_an_entry" + 0xe;
      newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
           (char *)((ulong)newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
                           indirect & 0xffffffffffffff00);
      newcoin.out.nValue = (CAmount)&PTR__lazy_ostream_0113a070;
      newcoin.out.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst
      ;
      local_480 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_478 = "";
      pvVar28 = &DAT_00000001;
      pvVar29 = (iterator)0x0;
      newcoin.out.scriptPubKey.super_CScriptBase._union._16_8_ = &txid;
      local_e8[0] = rVar15.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)&newcoin,1,0,WARN,(check_type)rng,
                 (size_t)&local_480,0x119);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      local_490 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_488 = "";
      local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_498 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_16.m_end = pvVar29;
      msg_16.m_begin = pvVar28;
      file_16.m_end = (iterator)0x11a;
      file_16.m_begin = (iterator)&local_490;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_4a0,
                 msg_16);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_4a19f5;
      txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ = (long)"missed_an_entry" + 0xf;
      newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
           (char *)((ulong)newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
                           indirect & 0xffffffffffffff00);
      newcoin.out.nValue = (CAmount)&PTR__lazy_ostream_0113a070;
      newcoin.out.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst
      ;
      local_4b0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_4a8 = "";
      pvVar28 = &DAT_00000001;
      pvVar29 = (iterator)0x0;
      newcoin.out.scriptPubKey.super_CScriptBase._union._16_8_ = &txid;
      local_e8[0] = rVar16.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)&newcoin,1,0,WARN,(check_type)rng,
                 (size_t)&local_4b0,0x11a);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      local_4c0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_4b8 = "";
      local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_17.m_end = pvVar29;
      msg_17.m_begin = pvVar28;
      file_17.m_end = (iterator)0x11b;
      file_17.m_begin = (iterator)&local_4c0;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_4d0,
                 msg_17);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_4a1a01;
      txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ = (long)"uncached_an_entry" + 0x11;
      newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
           (char *)((ulong)newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
                           indirect & 0xffffffffffffff00);
      newcoin.out.nValue = (CAmount)&PTR__lazy_ostream_0113a070;
      newcoin.out.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst
      ;
      local_4e0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_4d8 = "";
      pvVar28 = &DAT_00000001;
      pvVar29 = (iterator)0x0;
      newcoin.out.scriptPubKey.super_CScriptBase._union._16_8_ = &txid;
      local_e8[0] = rVar24.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)&newcoin,1,0,WARN,(check_type)rng,
                 (size_t)&local_4e0,0x11b);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      local_4f0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_4e8 = "";
      local_500 = &boost::unit_test::basic_cstring<char_const>::null;
      local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_18.m_end = pvVar29;
      msg_18.m_begin = pvVar28;
      file_18.m_end = (iterator)0x11c;
      file_18.m_begin = (iterator)&local_4f0;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_500,
                 msg_18);
      local_e8[0] = rVar17.super_class_property<bool>.value;
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_4a1a0d;
      txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
           (long)"flushed_without_erase" + 0x15;
      newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
           (char *)((ulong)newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
                           indirect & 0xffffffffffffff00);
      newcoin.out.nValue = (CAmount)&PTR__lazy_ostream_0113a070;
      newcoin.out.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst
      ;
      local_510 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_508 = "";
      newcoin.out.scriptPubKey.super_CScriptBase._union._16_8_ = &txid;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)&newcoin,1,0,WARN,(check_type)rng,
                 (size_t)&local_510,0x11c);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      std::
      _Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>::
      ~_Vector_base(&txids.
                     super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                   );
      std::
      vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
      ::~vector(&stack);
      std::
      _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
      ::~_Rb_tree(&result._M_t);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return;
      }
      __stack_chk_fail();
    }
    uVar20 = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                       (&pFVar30->super_RandomMixin<FastRandomContext>,
                        (long)txids.
                              super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)txids.
                              super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5);
    newcoin.out.nValue =
         *(CAmount *)
          txids.
          super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar20].m_wrapped.super_base_blob<256U>.m_data.
          _M_elems;
    newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
         (char *)*(undefined8 *)
                  (txids.
                   super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar20].m_wrapped.super_base_blob<256U>
                   .m_data._M_elems + 8);
    puVar1 = txids.
             super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar20].m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 0x10;
    newcoin.out.scriptPubKey.super_CScriptBase._union._8_8_ = *(undefined8 *)puVar1;
    newcoin.out.scriptPubKey.super_CScriptBase._union._16_8_ = *(undefined8 *)(puVar1 + 8);
    newcoin.out.scriptPubKey.super_CScriptBase._union._24_4_ = 0;
    txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = newcoin.out.nValue;
    txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
    txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         newcoin.out.scriptPubKey.super_CScriptBase._union._8_8_;
    txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
         newcoin.out.scriptPubKey.super_CScriptBase._union._16_8_;
    a = std::
        map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
        ::operator[](&result,(key_type *)&newcoin);
    uVar21 = RandomMixin<FastRandomContext>::randbits
                       (&pFVar30->super_RandomMixin<FastRandomContext>,2);
    uVar22 = RandomMixin<FastRandomContext>::randbits
                       (&pFVar30->super_RandomMixin<FastRandomContext>,2);
    if (uVar21 == 0) {
      pCVar4 = stack.
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
               .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
               _M_head_impl;
      newcoin.out.nValue._0_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0];
      newcoin.out.nValue._1_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[1];
      newcoin.out.nValue._2_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[2];
      newcoin.out.nValue._3_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[3];
      newcoin.out.nValue._4_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[4];
      newcoin.out.nValue._5_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[5];
      newcoin.out.nValue._6_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[6];
      newcoin.out.nValue._7_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[7];
      newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
           (char *)txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_;
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[8] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[9] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[10] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[0xb] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[0xc] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[0xd] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[0xe] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[0xf] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[0x10] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[0x11] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[0x12] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[0x13] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[0x14] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[0x15] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[0x16] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[0x17] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f];
      newcoin.out.scriptPubKey.super_CScriptBase._union._24_4_ = 0;
      bVar10 = (**(code **)(*(long *)&(pCVar4->super_CCoinsViewCache).super_CCoinsViewBacked + 8))
                         (pCVar4,(key_type *)&newcoin);
    }
    else {
      bVar10 = 0;
    }
    iVar18 = RandomMixin<FastRandomContext>::randrange<int>
                       (&pFVar30->super_RandomMixin<FastRandomContext>,500);
    puVar31 = stack.
              super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pCVar3 = &(stack.
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
               .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
              _M_head_impl)->super_CCoinsViewCache;
    if (iVar18 == 0) {
      local_560 = AccessByTxid(pCVar3,&txid);
    }
    else {
      newcoin.out.scriptPubKey.super_CScriptBase._union._8_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10];
      newcoin.out.scriptPubKey.super_CScriptBase._union._9_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11];
      newcoin.out.scriptPubKey.super_CScriptBase._union._10_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12];
      newcoin.out.scriptPubKey.super_CScriptBase._union._11_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13];
      newcoin.out.scriptPubKey.super_CScriptBase._union._12_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14];
      newcoin.out.scriptPubKey.super_CScriptBase._union._13_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15];
      newcoin.out.scriptPubKey.super_CScriptBase._union._14_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16];
      newcoin.out.scriptPubKey.super_CScriptBase._union._15_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17];
      newcoin.out.scriptPubKey.super_CScriptBase._union._16_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18];
      newcoin.out.scriptPubKey.super_CScriptBase._union._17_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19];
      newcoin.out.scriptPubKey.super_CScriptBase._union._18_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a];
      newcoin.out.scriptPubKey.super_CScriptBase._union._19_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b];
      newcoin.out.scriptPubKey.super_CScriptBase._union._20_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c];
      newcoin.out.scriptPubKey.super_CScriptBase._union._21_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d];
      newcoin.out.scriptPubKey.super_CScriptBase._union._22_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e];
      newcoin.out.scriptPubKey.super_CScriptBase._union._23_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f];
      newcoin.out.nValue._0_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0];
      newcoin.out.nValue._1_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[1];
      newcoin.out.nValue._2_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[2];
      newcoin.out.nValue._3_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[3];
      newcoin.out.nValue._4_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[4];
      newcoin.out.nValue._5_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[5];
      newcoin.out.nValue._6_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[6];
      newcoin.out.nValue._7_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[7];
      newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
           (char *)txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_;
      newcoin.out.scriptPubKey.super_CScriptBase._union._24_4_ = 0;
      local_560 = CCoinsViewCache::AccessCoin(pCVar3,(key_type *)&newcoin);
    }
    local_138 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    local_130 = "";
    local_148 = &boost::unit_test::basic_cstring<char_const>::null;
    local_140 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0xae;
    file.m_begin = (iterator)&local_138;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_148,msg);
    rVar9.super_class_property<bool>.value =
         (class_property<bool>)anon_unknown.dwarf_4a5d0d::operator==(a,local_560);
    peStack_e0 = (element_type *)0x0;
    sStack_d8.pi_ = (sp_counted_base *)0x0;
    local_1f0._0_8_ = "coin == entry";
    local_1f0.m_message.px = (element_type *)0xb691ac;
    newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
         (char *)((ulong)newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
                         indirect & 0xffffffffffffff00);
    newcoin.out.nValue = (CAmount)&PTR__lazy_ostream_0113a070;
    newcoin.out.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
    newcoin.out.scriptPubKey.super_CScriptBase._union._16_8_ = &local_1f0;
    local_158 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    local_150 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    local_e8[0] = rVar9.super_class_property<bool>.value;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_e8,(lazy_ostream *)&newcoin,1,0,WARN,(check_type)rng,
               (size_t)&local_158,0xae);
    boost::detail::shared_count::~shared_count(&sStack_d8);
    if (uVar21 == 0) {
      local_168 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_160 = "";
      local_178 = &boost::unit_test::basic_cstring<char_const>::null;
      local_170 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_00.m_end = in_R9;
      msg_00.m_begin = in_R8;
      file_00.m_end = (iterator)0xb1;
      file_00.m_begin = (iterator)&local_168;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_178,
                 msg_00);
      local_e8[0] = (class_property<bool>)(bVar10 ^ (local_560->out).nValue == -1);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_1f0._0_8_ = "result_havecoin == !entry.IsSpent()";
      local_1f0.m_message.px = (element_type *)0xb691d0;
      newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
           (char *)((ulong)newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
                           indirect & 0xffffffffffffff00);
      newcoin.out.nValue = (CAmount)&PTR__lazy_ostream_0113a070;
      newcoin.out.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst
      ;
      newcoin.out.scriptPubKey.super_CScriptBase._union._16_8_ = &local_1f0;
      local_188 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_180 = "";
      in_R8 = &DAT_00000001;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)&newcoin,1,0,WARN,(check_type)rng,
                 (size_t)&local_188,0xb1);
      boost::detail::shared_count::~shared_count(&sStack_d8);
    }
    if (uVar22 == 0) {
      pCVar4 = puVar31[-1]._M_t.
               super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
               .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
               _M_head_impl;
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[8] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[9] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[10] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[0xb] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[0xc] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[0xd] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[0xe] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[0xf] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[0x10] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[0x11] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[0x12] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[0x13] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[0x14] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[0x15] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[0x16] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e];
      newcoin.out.scriptPubKey.super_CScriptBase._union.direct[0x17] =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f];
      newcoin.out.nValue._0_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0];
      newcoin.out.nValue._1_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[1];
      newcoin.out.nValue._2_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[2];
      newcoin.out.nValue._3_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[3];
      newcoin.out.nValue._4_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[4];
      newcoin.out.nValue._5_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[5];
      newcoin.out.nValue._6_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[6];
      newcoin.out.nValue._7_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[7];
      newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
           (char *)txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_;
      newcoin.out.scriptPubKey.super_CScriptBase._union._24_4_ = 0;
      bVar10 = (**(code **)(*(long *)&(pCVar4->super_CCoinsViewCache).super_CCoinsViewBacked + 8))
                         (pCVar4,(key_type *)&newcoin);
      local_198 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_190 = "";
      local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_01.m_end = in_R9;
      msg_01.m_begin = in_R8;
      file_01.m_end = (iterator)0xb6;
      file_01.m_begin = (iterator)&local_198;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1a8,
                 msg_01);
      local_e8[0] = (class_property<bool>)(bVar10 ^ (local_560->out).nValue == -1);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_1f0._0_8_ = "ret == !entry.IsSpent()";
      local_1f0.m_message.px = (element_type *)0xb691e8;
      newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
           (char *)((ulong)newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
                           indirect & 0xffffffffffffff00);
      newcoin.out.nValue = (CAmount)&PTR__lazy_ostream_0113a070;
      newcoin.out.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst
      ;
      newcoin.out.scriptPubKey.super_CScriptBase._union._16_8_ = &local_1f0;
      local_1b8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_1b0 = "";
      in_R8 = &DAT_00000001;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)&newcoin,1,0,WARN,(check_type)rng,
                 (size_t)&local_1b8,0xb6);
      boost::detail::shared_count::~shared_count(&sStack_d8);
    }
    iVar18 = RandomMixin<FastRandomContext>::randrange<int>
                       (&rng->super_RandomMixin<FastRandomContext>,5);
    if ((iVar18 == 0) || ((a->out).nValue == -1)) {
      Coin::Coin(&newcoin);
      pFVar30 = rng;
      newcoin.out.nValue = RandMoney<FastRandomContext_&>(rng);
      newcoin._40_4_ = newcoin._40_4_ & 1 | 2;
      iVar18 = RandomMixin<FastRandomContext>::randrange<int>
                         (&rng->super_RandomMixin<FastRandomContext>,0x10);
      lVar5 = (a->out).nValue;
      uVar21 = RandomMixin<FastRandomContext>::randbits
                         (&rng->super_RandomMixin<FastRandomContext>,6);
      if ((iVar18 == 0) && (lVar5 == -1)) {
        local_e8[0] = (class_property<bool>)true;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::assign
                  (&newcoin.out.scriptPubKey.super_CScriptBase,(size_type)uVar21 + 1,local_e8);
        local_1c8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
        ;
        local_1c0 = "";
        local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_03.m_end = in_R9;
        msg_03.m_begin = in_R8;
        file_03.m_end = (iterator)0xc1;
        file_03.m_begin = (iterator)&local_1c8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1d8
                   ,msg_03);
        bVar11 = CScript::IsUnspendable(&newcoin.out.scriptPubKey);
        local_1f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(readonly_property<bool>)bVar11;
        local_1f0.m_message.px = (element_type *)0x0;
        local_1f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_200 = "newcoin.out.scriptPubKey.IsUnspendable()";
        local_1f8 = "";
        peStack_e0 = (element_type *)((ulong)peStack_e0 & 0xffffffffffffff00);
        local_e8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
        sStack_d8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        ppcStack_d0 = &local_200;
        local_210 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
        ;
        local_208 = "";
        in_R8 = &DAT_00000001;
        in_R9 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_1f0,(lazy_ostream *)local_e8,1,0,WARN,(check_type)pFVar30,
                   (size_t)&local_210,0xc1);
        boost::detail::shared_count::~shared_count(&local_1f0.m_message.pn);
        rVar13.super_class_property<bool>.value = (class_property<bool>)true;
      }
      else {
        local_e8 = (undefined1  [8])((ulong)(uint7)local_e8._1_7_ << 8);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::assign
                  (&newcoin.out.scriptPubKey.super_CScriptBase,(size_type)uVar21,local_e8);
        rVar9.super_class_property<bool>.value = (class_property<bool>)(class_property<bool>)true;
        if ((a->out).nValue == -1) {
          rVar14.super_class_property<bool>.value = (class_property<bool>)true;
          rVar9.super_class_property<bool>.value = rVar8.super_class_property<bool>.value;
        }
        rVar8.super_class_property<bool>.value = rVar9.super_class_property<bool>.value;
        Coin::operator=(a,&newcoin);
      }
      bVar11 = true;
      rng = pFVar30;
      if ((a->out).nValue == -1) {
        uVar21 = RandomMixin<FastRandomContext>::randbits<32>
                           (&pFVar30->super_RandomMixin<FastRandomContext>);
        bVar11 = (bool)((byte)uVar21 & 1);
        rng = pFVar30;
      }
      sStack_d8.pi_ = (sp_counted_base *)txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_
      ;
      ppcStack_d0 = (char **)txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_;
      local_e8[0] = (class_property<bool>)
                    (class_property<bool>)txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0];
      local_e8[1] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[1];
      local_e8[2] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[2];
      local_e8[3] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[3];
      local_e8[4] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[4];
      local_e8[5] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[5];
      local_e8[6] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[6];
      local_e8[7] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[7];
      peStack_e0 = (element_type *)txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_;
      local_c8 = 0;
      CCoinsViewCache::AddCoin
                (&(puVar31[-1]._M_t.
                   super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                  _M_head_impl)->super_CCoinsViewCache,(COutPoint *)local_e8,&newcoin,bVar11);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                (&newcoin.out.scriptPubKey.super_CScriptBase);
    }
    else {
      Coin::Clear(a);
      local_220 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_218 = "";
      local_230 = &boost::unit_test::basic_cstring<char_const>::null;
      local_228 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_02.m_end = in_R9;
      msg_02.m_begin = in_R8;
      file_02.m_end = (iterator)0xcf;
      file_02.m_begin = (iterator)&local_220;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_230,
                 msg_02);
      newcoin.out.scriptPubKey.super_CScriptBase._union._8_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10];
      newcoin.out.scriptPubKey.super_CScriptBase._union._9_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11];
      newcoin.out.scriptPubKey.super_CScriptBase._union._10_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12];
      newcoin.out.scriptPubKey.super_CScriptBase._union._11_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13];
      newcoin.out.scriptPubKey.super_CScriptBase._union._12_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14];
      newcoin.out.scriptPubKey.super_CScriptBase._union._13_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15];
      newcoin.out.scriptPubKey.super_CScriptBase._union._14_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16];
      newcoin.out.scriptPubKey.super_CScriptBase._union._15_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17];
      newcoin.out.scriptPubKey.super_CScriptBase._union._16_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18];
      newcoin.out.scriptPubKey.super_CScriptBase._union._17_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19];
      newcoin.out.scriptPubKey.super_CScriptBase._union._18_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a];
      newcoin.out.scriptPubKey.super_CScriptBase._union._19_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b];
      newcoin.out.scriptPubKey.super_CScriptBase._union._20_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c];
      newcoin.out.scriptPubKey.super_CScriptBase._union._21_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d];
      newcoin.out.scriptPubKey.super_CScriptBase._union._22_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e];
      newcoin.out.scriptPubKey.super_CScriptBase._union._23_1_ =
           txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f];
      newcoin.out.nValue._0_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0];
      newcoin.out.nValue._1_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[1];
      newcoin.out.nValue._2_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[2];
      newcoin.out.nValue._3_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[3];
      newcoin.out.nValue._4_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[4];
      newcoin.out.nValue._5_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[5];
      newcoin.out.nValue._6_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[6];
      newcoin.out.nValue._7_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[7];
      newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
           (char *)txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_;
      newcoin.out.scriptPubKey.super_CScriptBase._union._24_4_ = 0;
      bVar11 = CCoinsViewCache::SpendCoin
                         (&(puVar31[-1]._M_t.
                            super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                            .
                            super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                           ._M_head_impl)->super_CCoinsViewCache,(COutPoint *)&newcoin,(Coin *)0x0);
      local_1f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)bVar11;
      local_1f0.m_message.px = (element_type *)0x0;
      local_1f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_200 = "stack.back()->SpendCoin(COutPoint(txid, 0))";
      local_1f8 = "";
      peStack_e0 = (element_type *)((ulong)peStack_e0 & 0xffffffffffffff00);
      local_e8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
      sStack_d8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      ppcStack_d0 = &local_200;
      local_240 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_238 = "";
      in_R8 = &DAT_00000001;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_1f0,(lazy_ostream *)local_e8,1,0,WARN,(check_type)rng,(size_t)&local_240,
                 0xcf);
      boost::detail::shared_count::~shared_count(&local_1f0.m_message.pn);
      rVar12.super_class_property<bool>.value = (class_property<bool>)true;
    }
    this_00 = rng;
    iVar18 = RandomMixin<FastRandomContext>::randrange<int>
                       (&rng->super_RandomMixin<FastRandomContext>,10);
    if (iVar18 == 0) {
      uVar21 = RandomMixin<FastRandomContext>::randbits<32>
                         (&rng->super_RandomMixin<FastRandomContext>);
      uVar26 = (uVar21 & 0xffffffff) %
               (ulong)((long)txids.
                             super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)txids.
                             super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5);
      newcoin.out.nValue =
           *(CAmount *)
            txids.
            super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar26].m_wrapped.super_base_blob<256U>.m_data
            ._M_elems;
      newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
           (char *)*(undefined8 *)
                    (txids.
                     super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar26].m_wrapped.
                     super_base_blob<256U>.m_data._M_elems + 8);
      puVar1 = txids.
               super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar26].m_wrapped.super_base_blob<256U>.
               m_data._M_elems + 0x10;
      newcoin.out.scriptPubKey.super_CScriptBase._union._8_8_ = *(undefined8 *)puVar1;
      newcoin.out.scriptPubKey.super_CScriptBase._union._16_8_ = *(undefined8 *)(puVar1 + 8);
      newcoin.out.scriptPubKey.super_CScriptBase._union._24_4_ = 0;
      uVar21 = RandomMixin<FastRandomContext>::randbits<32>
                         (&rng->super_RandomMixin<FastRandomContext>);
      puVar27 = stack.
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar18 = (int)((uVar21 & 0xffffffff) %
                    (ulong)((long)puVar31 -
                            (long)stack.
                                  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3));
      CCoinsViewCache::Uncache
                (&(stack.
                   super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar18]._M_t.
                   super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                  _M_head_impl)->super_CCoinsViewCache,(COutPoint *)&newcoin);
      bVar11 = CCoinsViewCache::HaveCoinInCache
                         (&(puVar27[iVar18]._M_t.
                            super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                            .
                            super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                           ._M_head_impl)->super_CCoinsViewCache,(COutPoint *)&newcoin);
      rVar24.super_class_property<bool>.value =
           (class_property<bool>)((byte)rVar24.super_class_property<bool>.value | !bVar11);
    }
    iVar18 = RandomMixin<FastRandomContext>::randrange<int>
                       (&this_00->super_RandomMixin<FastRandomContext>,1000);
    p_Var23 = result._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((iVar19 == 39999) || (iVar18 == 1)) {
      for (; puVar31 = stack.
                       super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
          puVar27 = stack.
                    super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          (_Rb_tree_header *)p_Var23 != &result._M_t._M_impl.super__Rb_tree_header;
          p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23)) {
        outpoint = (COutPoint *)(p_Var23 + 1);
        pCVar4 = stack.
                 super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                 super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                 .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                 _M_head_impl;
        bVar10 = (**(code **)(*(long *)&(pCVar4->super_CCoinsViewCache).super_CCoinsViewBacked + 8))
                           (pCVar4,outpoint);
        a_00 = CCoinsViewCache::AccessCoin
                         (&(stack.
                            super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                            super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                            .
                            super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                           ._M_head_impl)->super_CCoinsViewCache,outpoint);
        local_250 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
        ;
        local_248 = "";
        local_260 = &boost::unit_test::basic_cstring<char_const>::null;
        local_258 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_04.m_end = in_R9;
        msg_04.m_begin = in_R8;
        file_04.m_end = (iterator)0xe0;
        file_04.m_begin = (iterator)&local_250;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_260
                   ,msg_04);
        peStack_e0 = (element_type *)0x0;
        sStack_d8.pi_ = (sp_counted_base *)0x0;
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_49dd2b;
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
             (long)"have == !coin.IsSpent()" + 0x17;
        newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
             (char *)((ulong)newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
                             indirect & 0xffffffffffffff00);
        newcoin.out.nValue = (CAmount)&PTR__lazy_ostream_0113a070;
        newcoin.out.scriptPubKey.super_CScriptBase._union._8_8_ =
             boost::unit_test::lazy_ostream::inst;
        local_270 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
        ;
        local_268 = "";
        pvVar28 = &DAT_00000001;
        pvVar29 = (iterator)0x0;
        newcoin.out.scriptPubKey.super_CScriptBase._union._16_8_ = &txid;
        local_e8[0] = (class_property<bool>)
                      (class_property<bool>)(bVar10 ^ (a_00->out).nValue == -1);
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_e8,(lazy_ostream *)&newcoin,1,0,WARN,
                   (check_type)this_00,(size_t)&local_270,0xe0);
        boost::detail::shared_count::~shared_count(&sStack_d8);
        local_280 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
        ;
        local_278 = "";
        local_290 = &boost::unit_test::basic_cstring<char_const>::null;
        local_288 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_05.m_end = pvVar29;
        msg_05.m_begin = pvVar28;
        file_05.m_end = (iterator)0xe1;
        file_05.m_begin = (iterator)&local_280;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_290
                   ,msg_05);
        local_e8[0] = (class_property<bool>)
                      anon_unknown.dwarf_4a5d0d::operator==(a_00,(Coin *)&p_Var23[2]._M_parent);
        peStack_e0 = (element_type *)0x0;
        sStack_d8.pi_ = (sp_counted_base *)0x0;
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_49dd45;
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
             (long)"coin == entry.second" + 0x14;
        newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
             (char *)((ulong)newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
                             indirect & 0xffffffffffffff00);
        newcoin.out.nValue = (CAmount)&PTR__lazy_ostream_0113a070;
        newcoin.out.scriptPubKey.super_CScriptBase._union._8_8_ =
             boost::unit_test::lazy_ostream::inst;
        local_2a0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
        ;
        local_298 = "";
        in_R8 = &DAT_00000001;
        in_R9 = (iterator)0x0;
        newcoin.out.scriptPubKey.super_CScriptBase._union._16_8_ = &txid;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_e8,(lazy_ostream *)&newcoin,1,0,WARN,
                   (check_type)this_00,(size_t)&local_2a0,0xe1);
        boost::detail::shared_count::~shared_count(&sStack_d8);
        if ((a_00->out).nValue == -1) {
          rVar16.super_class_property<bool>.value = (class_property<bool>)true;
        }
        else {
          local_2b0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
          ;
          local_2a8 = "";
          local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_06.m_end = in_R9;
          msg_06.m_begin = in_R8;
          file_06.m_end = (iterator)0xe5;
          file_06.m_begin = (iterator)&local_2b0;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
                     (size_t)&local_2c0,msg_06);
          bVar11 = CCoinsViewCache::HaveCoinInCache
                             (&(stack.
                                super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                                super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                                .
                                super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                               ._M_head_impl)->super_CCoinsViewCache,outpoint);
          local_e8[0] = (class_property<bool>)(class_property<bool>)bVar11;
          peStack_e0 = (element_type *)0x0;
          sStack_d8.pi_ = (sp_counted_base *)0x0;
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_4a1948;
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
               (long)"stack.back()->HaveCoinInCache(entry.first)" + 0x2a;
          newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
               (char *)((ulong)newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
                               indirect & 0xffffffffffffff00);
          newcoin.out.nValue = (CAmount)&PTR__lazy_ostream_0113a070;
          newcoin.out.scriptPubKey.super_CScriptBase._union._8_8_ =
               boost::unit_test::lazy_ostream::inst;
          local_2d0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
          ;
          local_2c8 = "";
          in_R8 = &DAT_00000001;
          in_R9 = (iterator)0x0;
          newcoin.out.scriptPubKey.super_CScriptBase._union._16_8_ = &txid;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_e8,(lazy_ostream *)&newcoin,1,0,WARN,
                     (check_type)this_00,(size_t)&local_2d0,0xe5);
          boost::detail::shared_count::~shared_count(&sStack_d8);
          rVar15.super_class_property<bool>.value = (class_property<bool>)true;
        }
      }
      for (; puVar27 != puVar31; puVar27 = puVar27 + 1) {
        anon_unknown.dwarf_4a5d0d::CCoinsViewCacheTest::SelfTest
                  ((puVar27->_M_t).
                   super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                   _M_head_impl,true);
      }
    }
    iVar18 = RandomMixin<FastRandomContext>::randrange<int>
                       (&this_00->super_RandomMixin<FastRandomContext>,100);
    puVar27 = stack.
              super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pFVar30 = this_00;
    if (((iVar18 == 0) &&
        (uVar26 = (long)puVar31 -
                  (long)stack.
                        super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3, 1 < uVar26)) &&
       (bVar11 = RandomMixin<FastRandomContext>::randbool
                           (&this_00->super_RandomMixin<FastRandomContext>), !bVar11)) {
      uVar20 = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                         (&this_00->super_RandomMixin<FastRandomContext>,uVar26 - 1);
      if (fake_best_block) {
        pCVar3 = &(puVar27[uVar20 & 0xffffffff]._M_t.
                   super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                  _M_head_impl)->super_CCoinsViewCache;
        RandomMixin<FastRandomContext>::rand256
                  ((uint256 *)&newcoin,&this_00->super_RandomMixin<FastRandomContext>);
        this_00 = pFVar30;
        CCoinsViewCache::SetBestBlock(pCVar3,(uint256 *)&newcoin);
        pFVar30 = this_00;
      }
      iVar18 = RandomMixin<FastRandomContext>::randrange<int>
                         (&this_00->super_RandomMixin<FastRandomContext>,4);
      local_2e0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_2d8 = "";
      local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_07.m_end = in_R9;
      msg_07.m_begin = in_R8;
      file_07.m_end = (iterator)0xf4;
      file_07.m_begin = (iterator)&local_2e0;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2f0,
                 msg_07);
      pCVar3 = &(puVar27[uVar20 & 0xffffffff]._M_t.
                 super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                 .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                _M_head_impl)->super_CCoinsViewCache;
      if (iVar18 < 3) {
        bVar11 = CCoinsViewCache::Flush(pCVar3);
      }
      else {
        bVar11 = CCoinsViewCache::Sync(pCVar3);
      }
      local_e8[0] = (class_property<bool>)(class_property<bool>)bVar11;
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_4a1961;
      txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
           (long)"should_erase ? stack[flushIndex]->Flush() : stack[flushIndex]->Sync()" + 0x45;
      newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
           (char *)((ulong)newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
                           indirect & 0xffffffffffffff00);
      newcoin.out.nValue = (CAmount)&PTR__lazy_ostream_0113a070;
      newcoin.out.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst
      ;
      local_300 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_2f8 = "";
      in_R8 = &DAT_00000001;
      in_R9 = (iterator)0x0;
      newcoin.out.scriptPubKey.super_CScriptBase._union._16_8_ = &txid;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)&newcoin,1,0,WARN,(check_type)pFVar30,
                 (size_t)&local_300,0xf4);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      rVar17.super_class_property<bool>.value =
           (class_property<bool>)((byte)rVar17.super_class_property<bool>.value | 2 < iVar18);
    }
    iVar18 = RandomMixin<FastRandomContext>::randrange<int>
                       (&pFVar30->super_RandomMixin<FastRandomContext>,100);
    puVar27 = stack.
              super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    rng = pFVar30;
    if (iVar18 == 0) {
      if ((puVar31 !=
           stack.
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start) &&
         (bVar11 = RandomMixin<FastRandomContext>::randbool
                             (&pFVar30->super_RandomMixin<FastRandomContext>), !bVar11)) {
        if (fake_best_block) {
          pCVar3 = &(puVar31[-1]._M_t.
                     super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                    _M_head_impl)->super_CCoinsViewCache;
          RandomMixin<FastRandomContext>::rand256
                    ((uint256 *)&newcoin,&pFVar30->super_RandomMixin<FastRandomContext>);
          CCoinsViewCache::SetBestBlock(pCVar3,(uint256 *)&newcoin);
        }
        iVar18 = RandomMixin<FastRandomContext>::randrange<int>
                           (&pFVar30->super_RandomMixin<FastRandomContext>,4);
        local_310 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
        ;
        local_308 = "";
        local_320 = &boost::unit_test::basic_cstring<char_const>::null;
        local_318 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_08.m_end = in_R9;
        msg_08.m_begin = in_R8;
        file_08.m_end = (iterator)0xfe;
        file_08.m_begin = (iterator)&local_310;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_320
                   ,msg_08);
        pCVar3 = &(puVar31[-1]._M_t.
                   super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                  _M_head_impl)->super_CCoinsViewCache;
        if (iVar18 < 3) {
          bVar11 = CCoinsViewCache::Flush(pCVar3);
        }
        else {
          bVar11 = CCoinsViewCache::Sync(pCVar3);
        }
        local_e8[0] = (class_property<bool>)(class_property<bool>)bVar11;
        peStack_e0 = (element_type *)0x0;
        sStack_d8.pi_ = (sp_counted_base *)0x0;
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_4a197a;
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
             (long)"should_erase ? stack.back()->Flush() : stack.back()->Sync()" + 0x3b;
        newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
             (char *)((ulong)newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
                             indirect & 0xffffffffffffff00);
        newcoin.out.nValue = (CAmount)&PTR__lazy_ostream_0113a070;
        newcoin.out.scriptPubKey.super_CScriptBase._union._8_8_ =
             boost::unit_test::lazy_ostream::inst;
        local_330 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
        ;
        local_328 = "";
        in_R8 = &DAT_00000001;
        in_R9 = (iterator)0x0;
        newcoin.out.scriptPubKey.super_CScriptBase._union._16_8_ = &txid;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_e8,(lazy_ostream *)&newcoin,1,0,WARN,
                   (check_type)pFVar30,(size_t)&local_330,0xfe);
        boost::detail::shared_count::~shared_count(&sStack_d8);
        rVar17.super_class_property<bool>.value =
             (class_property<bool>)((byte)rVar17.super_class_property<bool>.value | 2 < iVar18);
        stack.
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar31 + -1;
        std::
        unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
        ::~unique_ptr(stack.
                      super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
        puVar31 = stack.
                  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      if (puVar31 == puVar27) {
        rVar6.super_class_property<bool>.value = (class_property<bool>)true;
        puVar31 = (pointer)&base_local;
      }
      else {
        rng = pFVar30;
        if ((0x1f < (ulong)((long)puVar31 - (long)puVar27)) ||
           (bVar11 = RandomMixin<FastRandomContext>::randbool
                               (&pFVar30->super_RandomMixin<FastRandomContext>), rng = pFVar30,
           !bVar11)) goto LAB_002bba52;
        newcoin.out.nValue = (CAmount)base_local;
        puVar31 = puVar31 + -1;
      }
      newcoin.out.nValue =
           (CAmount)(puVar31->_M_t).
                    super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                    _M_head_impl;
      std::make_unique<(anonymous_namespace)::CCoinsViewCacheTest,CCoinsView*&>
                ((CCoinsView **)local_e8);
      std::
      vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
      ::push_back(&stack,(value_type *)local_e8);
      rng = pFVar30;
      if (local_e8 != (undefined1  [8])0x0) {
        (*(((CCoinsViewCache *)local_e8)->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView
          [7])();
      }
      if ((long)stack.
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)stack.
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x20) {
        rVar7.super_class_property<bool>.value = (class_property<bool>)true;
      }
    }
LAB_002bba52:
    iVar19 = iVar19 + 1;
  } while( true );
}

Assistant:

void SimulationTest(CCoinsView* base, bool fake_best_block)
{
    // Various coverage trackers.
    bool removed_all_caches = false;
    bool reached_4_caches = false;
    bool added_an_entry = false;
    bool added_an_unspendable_entry = false;
    bool removed_an_entry = false;
    bool updated_an_entry = false;
    bool found_an_entry = false;
    bool missed_an_entry = false;
    bool uncached_an_entry = false;
    bool flushed_without_erase = false;

    // A simple map to track what we expect the cache stack to represent.
    std::map<COutPoint, Coin> result;

    // The cache stack.
    std::vector<std::unique_ptr<CCoinsViewCacheTest>> stack; // A stack of CCoinsViewCaches on top.
    stack.push_back(std::make_unique<CCoinsViewCacheTest>(base)); // Start with one cache.

    // Use a limited set of random transaction ids, so we do test overwriting entries.
    std::vector<Txid> txids;
    txids.resize(NUM_SIMULATION_ITERATIONS / 8);
    for (unsigned int i = 0; i < txids.size(); i++) {
        txids[i] = Txid::FromUint256(m_rng.rand256());
    }

    for (unsigned int i = 0; i < NUM_SIMULATION_ITERATIONS; i++) {
        // Do a random modification.
        {
            auto txid = txids[m_rng.randrange(txids.size())]; // txid we're going to modify in this iteration.
            Coin& coin = result[COutPoint(txid, 0)];

            // Determine whether to test HaveCoin before or after Access* (or both). As these functions
            // can influence each other's behaviour by pulling things into the cache, all combinations
            // are tested.
            bool test_havecoin_before = m_rng.randbits(2) == 0;
            bool test_havecoin_after = m_rng.randbits(2) == 0;

            bool result_havecoin = test_havecoin_before ? stack.back()->HaveCoin(COutPoint(txid, 0)) : false;

            // Infrequently, test usage of AccessByTxid instead of AccessCoin - the
            // former just delegates to the latter and returns the first unspent in a txn.
            const Coin& entry = (m_rng.randrange(500) == 0) ?
                AccessByTxid(*stack.back(), txid) : stack.back()->AccessCoin(COutPoint(txid, 0));
            BOOST_CHECK(coin == entry);

            if (test_havecoin_before) {
                BOOST_CHECK(result_havecoin == !entry.IsSpent());
            }

            if (test_havecoin_after) {
                bool ret = stack.back()->HaveCoin(COutPoint(txid, 0));
                BOOST_CHECK(ret == !entry.IsSpent());
            }

            if (m_rng.randrange(5) == 0 || coin.IsSpent()) {
                Coin newcoin;
                newcoin.out.nValue = RandMoney(m_rng);
                newcoin.nHeight = 1;

                // Infrequently test adding unspendable coins.
                if (m_rng.randrange(16) == 0 && coin.IsSpent()) {
                    newcoin.out.scriptPubKey.assign(1 + m_rng.randbits(6), OP_RETURN);
                    BOOST_CHECK(newcoin.out.scriptPubKey.IsUnspendable());
                    added_an_unspendable_entry = true;
                } else {
                    // Random sizes so we can test memory usage accounting
                    newcoin.out.scriptPubKey.assign(m_rng.randbits(6), 0);
                    (coin.IsSpent() ? added_an_entry : updated_an_entry) = true;
                    coin = newcoin;
                }
                bool is_overwrite = !coin.IsSpent() || m_rng.rand32() & 1;
                stack.back()->AddCoin(COutPoint(txid, 0), std::move(newcoin), is_overwrite);
            } else {
                // Spend the coin.
                removed_an_entry = true;
                coin.Clear();
                BOOST_CHECK(stack.back()->SpendCoin(COutPoint(txid, 0)));
            }
        }

        // Once every 10 iterations, remove a random entry from the cache
        if (m_rng.randrange(10) == 0) {
            COutPoint out(txids[m_rng.rand32() % txids.size()], 0);
            int cacheid = m_rng.rand32() % stack.size();
            stack[cacheid]->Uncache(out);
            uncached_an_entry |= !stack[cacheid]->HaveCoinInCache(out);
        }

        // Once every 1000 iterations and at the end, verify the full cache.
        if (m_rng.randrange(1000) == 1 || i == NUM_SIMULATION_ITERATIONS - 1) {
            for (const auto& entry : result) {
                bool have = stack.back()->HaveCoin(entry.first);
                const Coin& coin = stack.back()->AccessCoin(entry.first);
                BOOST_CHECK(have == !coin.IsSpent());
                BOOST_CHECK(coin == entry.second);
                if (coin.IsSpent()) {
                    missed_an_entry = true;
                } else {
                    BOOST_CHECK(stack.back()->HaveCoinInCache(entry.first));
                    found_an_entry = true;
                }
            }
            for (const auto& test : stack) {
                test->SelfTest();
            }
        }

        if (m_rng.randrange(100) == 0) {
            // Every 100 iterations, flush an intermediate cache
            if (stack.size() > 1 && m_rng.randbool() == 0) {
                unsigned int flushIndex = m_rng.randrange(stack.size() - 1);
                if (fake_best_block) stack[flushIndex]->SetBestBlock(m_rng.rand256());
                bool should_erase = m_rng.randrange(4) < 3;
                BOOST_CHECK(should_erase ? stack[flushIndex]->Flush() : stack[flushIndex]->Sync());
                flushed_without_erase |= !should_erase;
            }
        }
        if (m_rng.randrange(100) == 0) {
            // Every 100 iterations, change the cache stack.
            if (stack.size() > 0 && m_rng.randbool() == 0) {
                //Remove the top cache
                if (fake_best_block) stack.back()->SetBestBlock(m_rng.rand256());
                bool should_erase = m_rng.randrange(4) < 3;
                BOOST_CHECK(should_erase ? stack.back()->Flush() : stack.back()->Sync());
                flushed_without_erase |= !should_erase;
                stack.pop_back();
            }
            if (stack.size() == 0 || (stack.size() < 4 && m_rng.randbool())) {
                //Add a new cache
                CCoinsView* tip = base;
                if (stack.size() > 0) {
                    tip = stack.back().get();
                } else {
                    removed_all_caches = true;
                }
                stack.push_back(std::make_unique<CCoinsViewCacheTest>(tip));
                if (stack.size() == 4) {
                    reached_4_caches = true;
                }
            }
        }
    }

    // Verify coverage.
    BOOST_CHECK(removed_all_caches);
    BOOST_CHECK(reached_4_caches);
    BOOST_CHECK(added_an_entry);
    BOOST_CHECK(added_an_unspendable_entry);
    BOOST_CHECK(removed_an_entry);
    BOOST_CHECK(updated_an_entry);
    BOOST_CHECK(found_an_entry);
    BOOST_CHECK(missed_an_entry);
    BOOST_CHECK(uncached_an_entry);
    BOOST_CHECK(flushed_without_erase);
}